

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

int Abc_NtkRecAddCut3(If_Man_t *pIfMan,If_Obj_t *pRoot,If_Cut_t *pCut)

{
  Vec_Ptr_t *vNodes_00;
  Gia_Man_t *p_00;
  Lms_Man_t *pLVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int c;
  word *pwVar6;
  abctime aVar7;
  abctime aVar8;
  Gia_Obj_t *pGVar9;
  If_Obj_t *pIVar10;
  abctime clk;
  word *pTruth;
  If_Obj_t *pIfObj;
  Gia_Obj_t *pDriver;
  Gia_Man_t *pGia;
  Vec_Ptr_t *vNodes;
  int local_60;
  int nLeaves;
  int fHole;
  int iFanin1;
  int iFanin0;
  int Index;
  int i;
  uint uCanonPhase;
  char pCanonPerm [16];
  Lms_Man_t *p;
  If_Cut_t *pCut_local;
  If_Obj_t *pRoot_local;
  If_Man_t *pIfMan_local;
  
  pLVar1 = s_pMan3;
  iVar2 = If_CutLeaveNum(pCut);
  vNodes_00 = pLVar1->vNodes;
  p_00 = pLVar1->pGia;
  pTruth = (word *)0x0;
  pLVar1->nTried = pLVar1->nTried + 1;
  if (pLVar1->nVars != (*(uint *)&pCut->field_0x1c >> 0x10 & 0xff)) {
    __assert_fail("p->nVars == (int)pCut->nLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0x2c3,"int Abc_NtkRecAddCut3(If_Man_t *, If_Obj_t *, If_Cut_t *)");
  }
  if (iVar2 < 2) {
LAB_003592d7:
    pLVar1->nFilterSize = pLVar1->nFilterSize + 1;
  }
  else {
    if (iVar2 == 2) {
      pwVar6 = If_CutTruthW(pIfMan,pCut);
      iVar3 = Abc_TtSupportSize(pwVar6,2);
      if (iVar3 != 2) goto LAB_003592d7;
    }
    aVar7 = Abc_Clock();
    pwVar6 = If_CutTruthW(pIfMan,pCut);
    memcpy(pLVar1->pTemp1,pwVar6,(long)pLVar1->nWords << 3);
    uVar4 = Abc_TtCanonicize(pLVar1->pTemp1,iVar2,(char *)&i);
    Abc_TtStretch5((uint *)pLVar1->pTemp1,iVar2,pLVar1->nVars);
    aVar8 = Abc_Clock();
    pLVar1->timeCanon = (aVar8 - aVar7) + pLVar1->timeCanon;
    if (pLVar1->pGia == (Gia_Man_t *)0x0) {
      aVar7 = Abc_Clock();
      Vec_MemHashInsert(pLVar1->vTtMem,pLVar1->pTemp1);
      pLVar1->nAdded = pLVar1->nAdded + 1;
      aVar8 = Abc_Clock();
      pLVar1->timeInsert = (aVar8 - aVar7) + pLVar1->timeInsert;
    }
    else {
      aVar7 = Abc_Clock();
      If_CutTraverse(pIfMan,pRoot,pCut,vNodes_00);
      aVar8 = Abc_Clock();
      pLVar1->timeTruth = (aVar8 - aVar7) + pLVar1->timeTruth;
      iVar3 = Vec_PtrSize(vNodes_00);
      if (iVar3 < 0xfe) {
        aVar7 = Abc_Clock();
        for (iFanin0 = 0; iFanin0 < iVar2; iFanin0 = iFanin0 + 1) {
          pGVar9 = Gia_ManPi(p_00,iFanin0);
          iVar3 = Gia_ObjId(p_00,pGVar9);
          iVar3 = Abc_Var2Lit(iVar3,uVar4 >> ((byte)iFanin0 & 0x1f) & 1);
          pIVar10 = If_ManObj(pIfMan,(int)(&pCut[1].Area)[(int)*(char *)((long)&i + (long)iFanin0)])
          ;
          (pIVar10->field_22).iCopy = iVar3;
        }
        local_60 = 0;
        iVar3 = Vec_PtrSize(vNodes_00);
        iFanin0 = iVar2;
        if (iVar3 < 1) {
          __assert_fail("Vec_PtrSize(vNodes) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                        ,0x2fc,"int Abc_NtkRecAddCut3(If_Man_t *, If_Obj_t *, If_Cut_t *)");
        }
        for (; iVar3 = Vec_PtrSize(vNodes_00), iFanin0 < iVar3; iFanin0 = iFanin0 + 1) {
          pTruth = (word *)Vec_PtrEntry(vNodes_00,iFanin0);
          iVar3 = If_ObjIsCi((If_Obj_t *)pTruth);
          if (iVar3 == 0) {
            pIVar10 = If_ObjFanin0((If_Obj_t *)pTruth);
            iVar3 = (pIVar10->field_22).iCopy;
            iVar5 = If_ObjFaninC0((If_Obj_t *)pTruth);
            iVar5 = Abc_LitNotCond(iVar3,iVar5);
            pIVar10 = If_ObjFanin1((If_Obj_t *)pTruth);
            iVar3 = (pIVar10->field_22).iCopy;
            c = If_ObjFaninC1((If_Obj_t *)pTruth);
            iVar3 = Abc_LitNotCond(iVar3,c);
            iVar3 = Gia_ManHashAnd(p_00,iVar5,iVar3);
            (((If_Obj_t *)pTruth)->field_22).iCopy = iVar3;
          }
          else {
            (((If_Obj_t *)pTruth)->field_22).iCopy = 0;
            local_60 = 1;
          }
        }
        pLVar1->nHoleInTheWall = local_60 + pLVar1->nHoleInTheWall;
        aVar8 = Abc_Clock();
        pLVar1->timeBuild = (aVar8 - aVar7) + pLVar1->timeBuild;
        iVar3 = If_ObjIsAnd((If_Obj_t *)pTruth);
        if (iVar3 == 0) {
          __assert_fail("If_ObjIsAnd(pIfObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                        ,0x30d,"int Abc_NtkRecAddCut3(If_Man_t *, If_Obj_t *, If_Cut_t *)");
        }
        iVar3 = Abc_Lit2Var((int)pTruth[8]);
        pGVar9 = Gia_ManObj(p_00,iVar3);
        if ((*(ulong *)pGVar9 >> 0x3e & 1) == 0) {
          *(ulong *)pGVar9 = *(ulong *)pGVar9 & 0xbfffffffffffffff | 0x4000000000000000;
          iVar2 = Abc_LitNotCond((int)pTruth[8],uVar4 >> ((byte)iVar2 & 0x1f) & 1);
          Gia_ManAppendCo(p_00,iVar2);
          aVar7 = Abc_Clock();
          iVar2 = Gia_ManCoNum(p_00);
          pGVar9 = Gia_ManCo(p_00,iVar2 + -1);
          pwVar6 = Gia_ObjComputeTruthTable(p_00,pGVar9);
          aVar8 = Abc_Clock();
          pLVar1->timeCheck = (aVar8 - aVar7) + pLVar1->timeCheck;
          iVar2 = memcmp(pLVar1->pTemp1,pwVar6,(long)pLVar1->nWords << 3);
          if (iVar2 == 0) {
            aVar7 = Abc_Clock();
            iVar2 = Vec_MemHashInsert(pLVar1->vTtMem,pLVar1->pTemp1);
            Vec_IntPush(pLVar1->vTruthIds,iVar2);
            iVar2 = Gia_ManCoNum(p_00);
            iVar3 = Vec_IntSize(pLVar1->vTruthIds);
            if (iVar2 != iVar3) {
              __assert_fail("Gia_ManCoNum(pGia) == Vec_IntSize(p->vTruthIds)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                            ,0x330,"int Abc_NtkRecAddCut3(If_Man_t *, If_Obj_t *, If_Cut_t *)");
            }
            pLVar1->nAdded = pLVar1->nAdded + 1;
            aVar8 = Abc_Clock();
            pLVar1->timeInsert = (aVar8 - aVar7) + pLVar1->timeInsert;
          }
          else {
            iVar2 = Gia_ManCoNum(p_00);
            Gia_ManPatchCoDriver(p_00,iVar2 + -1,0);
            Vec_IntPush(pLVar1->vTruthIds,-1);
            pLVar1->nFilterTruth = pLVar1->nFilterTruth + 1;
          }
        }
        else {
          pLVar1->nFilterSame = pLVar1->nFilterSame + 1;
        }
      }
      else {
        pLVar1->nFilterSize = pLVar1->nFilterSize + 1;
      }
    }
  }
  return 1;
}

Assistant:

int Abc_NtkRecAddCut3( If_Man_t * pIfMan, If_Obj_t * pRoot, If_Cut_t * pCut )
{
    Lms_Man_t * p = s_pMan3;
    char pCanonPerm[LMS_VAR_MAX];
    unsigned uCanonPhase;
    int i, Index, iFanin0, iFanin1, fHole;
    int nLeaves = If_CutLeaveNum(pCut);
    Vec_Ptr_t * vNodes = p->vNodes;
    Gia_Man_t * pGia = p->pGia;
    Gia_Obj_t * pDriver;
    If_Obj_t * pIfObj = NULL;
    word * pTruth;
    abctime clk;
    p->nTried++;

    // skip small cuts
    assert( p->nVars == (int)pCut->nLimit );
    if ( nLeaves < 2 || (nLeaves == 2 && Abc_TtSupportSize(If_CutTruthW(pIfMan, pCut), 2) != 2) )
    {
        p->nFilterSize++;
        return 1;
    }

//    if ( p->vTtMem2 )
//        Vec_MemHashInsert( p->vTtMem2, If_CutTruthW(pCut) );

    // semi-canonicize truth table
clk = Abc_Clock();
    memcpy( p->pTemp1, If_CutTruthW(pIfMan, pCut), p->nWords * sizeof(word) );
#ifdef LMS_USE_OLD_FORM
    uCanonPhase = Kit_TruthSemiCanonicize( (unsigned *)p->pTemp1, (unsigned *)p->pTemp2, nLeaves, pCanonPerm );
#else
    uCanonPhase = Abc_TtCanonicize( p->pTemp1, nLeaves, pCanonPerm );
#endif
    Abc_TtStretch5( (unsigned *)p->pTemp1, nLeaves, p->nVars );
p->timeCanon += Abc_Clock() - clk;
    // pCanonPerm and uCanonPhase show what was the variable corresponding to each var in the current truth

    if ( p->pGia == NULL )
    {
clk = Abc_Clock();
        // add the resulting truth table to the hash table 
        Index = Vec_MemHashInsert( p->vTtMem, p->pTemp1 );
/*
        if ( p->vTruthFreqs == NULL )
            p->vTruthFreqs = Vec_IntAlloc( 1000 );
        assert( Index <= Vec_IntSize(p->vTruthFreqs)  );
        if ( Index < Vec_IntSize(p->vTruthFreqs) )
            Vec_IntAddToEntry( p->vTruthFreqs, Index, 1 );
        else
            Vec_IntPush( p->vTruthFreqs, 1 );
*/
        p->nAdded++;
p->timeInsert += Abc_Clock() - clk;
        return 1;
    }

    // collect internal nodes and skip redundant cuts
clk = Abc_Clock();
    If_CutTraverse( pIfMan, pRoot, pCut, vNodes );
p->timeTruth += Abc_Clock() - clk;
    if ( Vec_PtrSize(vNodes) > 253 )
    {
        p->nFilterSize++;
        return 1;
    }

clk = Abc_Clock();
    // map cut leaves into elementary variables of GIA
    for ( i = 0; i < nLeaves; i++ )
        If_ManObj( pIfMan, pCut->pLeaves[(int)pCanonPerm[i]] )->iCopy = Abc_Var2Lit( Gia_ObjId(pGia, Gia_ManPi(pGia, i)), (uCanonPhase >> i) & 1 );
    // build internal nodes
    fHole = 0;
    assert( Vec_PtrSize(vNodes) > 0 );
    Vec_PtrForEachEntryStart( If_Obj_t *, vNodes, pIfObj, i, nLeaves )
    {
        if ( If_ObjIsCi(pIfObj) )
        {
            pIfObj->iCopy = 0;
            fHole = 1;
            continue;
        }
        iFanin0 = Abc_LitNotCond( If_ObjFanin0(pIfObj)->iCopy, If_ObjFaninC0(pIfObj) );
        iFanin1 = Abc_LitNotCond( If_ObjFanin1(pIfObj)->iCopy, If_ObjFaninC1(pIfObj) );
        pIfObj->iCopy = Gia_ManHashAnd( pGia, iFanin0, iFanin1 );
    }
    p->nHoleInTheWall += fHole;
p->timeBuild += Abc_Clock() - clk;

    // check if this node is already driving a PO
    assert( If_ObjIsAnd(pIfObj) );
    pDriver = Gia_ManObj(pGia, Abc_Lit2Var(pIfObj->iCopy));
    if ( pDriver->fMark1 )
    {
        p->nFilterSame++;
        return 1;
    }
    pDriver->fMark1 = 1;
    // create output
    Gia_ManAppendCo( pGia, Abc_LitNotCond( pIfObj->iCopy, (uCanonPhase >> nLeaves) & 1 ) );

    // verify truth table
clk = Abc_Clock();
    pTruth = Gia_ObjComputeTruthTable( pGia, Gia_ManCo(pGia, Gia_ManCoNum(pGia)-1) );
p->timeCheck += Abc_Clock() - clk;
    if ( memcmp( p->pTemp1, pTruth, p->nWords * sizeof(word) ) != 0 )
    {
/*
        Kit_DsdPrintFromTruth( pTruth, nLeaves ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned *)p->pTemp1, nLeaves ); printf( "\n" );
        printf( "Truth table verification has failed.\n" );
*/
        // drive PO with constant
        Gia_ManPatchCoDriver( pGia, Gia_ManCoNum(pGia)-1, 0 );
        // save truth table ID
        Vec_IntPush( p->vTruthIds, -1 );
        p->nFilterTruth++;
        return 1;
    }

clk = Abc_Clock();
    // add the resulting truth table to the hash table 
    Index = Vec_MemHashInsert( p->vTtMem, p->pTemp1 );
    // save truth table ID
    Vec_IntPush( p->vTruthIds, Index );
    assert( Gia_ManCoNum(pGia) == Vec_IntSize(p->vTruthIds) );
    p->nAdded++;
p->timeInsert += Abc_Clock() - clk;
    return 1;
}